

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

int main(void)

{
  undefined1 auVar1 [16];
  bool bVar2;
  char cVar3;
  char cVar4;
  short sVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  undefined8 uVar12;
  char *pcVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int16_t s;
  int8_t c;
  int32_t i;
  chck_buffer buf;
  char data [33];
  char bb [33];
  short local_b8;
  char local_b5;
  int local_b4;
  long *local_b0;
  long *local_a8;
  long local_a0;
  byte local_90;
  undefined1 local_8f;
  undefined8 local_88;
  char cStack_80;
  char cStack_7f;
  char cStack_7e;
  char cStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  char cStack_79;
  char cStack_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  char cStack_74;
  char cStack_73;
  undefined2 uStack_72;
  char acStack_70 [20];
  uint local_5c;
  char *local_58 [5];
  
  cVar3 = chck_buffer(&local_b0,1,2);
  if (cVar3 == '\0') {
    __assert_fail("chck_buffer(&buf, 1, CHCK_ENDIANESS_NATIVE)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0xf,"int main(void)");
  }
  local_8f = 0;
  free(local_b0);
  chck_buffer_release(&local_b0);
  cStack_78 = 0x20;
  cStack_77 = 0x74;
  cStack_76 = 0x68;
  cStack_75 = 0x69;
  cStack_74 = 0x73;
  cStack_73 = 0x20;
  uStack_72 = 0x616d;
  builtin_strncpy(acStack_70,"ny bytes",9);
  local_88 = (char *)0x682049206f6c6f79;
  cStack_80 = 0x61;
  cStack_7f = 0x76;
  cStack_7e = 0x65;
  cStack_7d = 0x20;
  cStack_7c = 0x6f;
  cStack_7b = 0x6e;
  cStack_7a = 0x6c;
  cStack_79 = 0x79;
  cVar3 = chck_buffer_from_pointer(&local_b0,&local_88,0x21,2);
  if (cVar3 == '\0') {
    __assert_fail("chck_buffer_from_pointer(&buf, data, sizeof(data), CHCK_ENDIANESS_NATIVE)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x19,"int main(void)");
  }
  lVar9 = chck_buffer_read(local_58,1,0x21,&local_b0);
  if (lVar9 != 0x21) {
    __assert_fail("chck_buffer_read(bb, 1, sizeof(data), &buf) == sizeof(data)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x1b,"int main(void)");
  }
  chck_buffer_seek(&local_b0,0,0);
  lVar9 = chck_buffer_read(local_58,1,0x84,&local_b0);
  if (lVar9 != 0x21) {
    __assert_fail("chck_buffer_read(bb, 1, sizeof(data) * 4, &buf) == sizeof(data)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x1d,"int main(void)");
  }
  chck_buffer_seek(&local_b0,0,0);
  lVar9 = chck_buffer_read(local_58,8,0x21,&local_b0);
  if (lVar9 != 4) {
    __assert_fail("chck_buffer_read(bb, 8, sizeof(data), &buf) == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x1f,"int main(void)");
  }
  lVar9 = chck_buffer_read(local_58,0xc,0x21,&local_b0);
  if (lVar9 != 0) {
    __assert_fail("chck_buffer_read(bb, 12, sizeof(data), &buf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x20,"int main(void)");
  }
  lVar9 = chck_buffer_read(local_58,1,0x21,&local_b0);
  if (lVar9 != 1) {
    __assert_fail("chck_buffer_read(bb, 1, sizeof(data), &buf) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x21,"int main(void)");
  }
  chck_buffer_release(&local_b0);
  cVar3 = chck_buffer(&local_b0,1,2);
  if (cVar3 == '\0') {
    __assert_fail("chck_buffer(&buf, 1, CHCK_ENDIANESS_NATIVE)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x28,"int main(void)");
  }
  lVar9 = chck_buffer_write_format
                    (&local_b0,"Hello %s, I\'m in your buffer at %d:%.2d clock!","buffer",10,0);
  if (lVar9 != 0x30) {
    __assert_fail("chck_buffer_write_format(&buf, \"Hello %s, I\'m in your buffer at %d:%.2d clock!\", \"buffer\", 10, 0) == strlen(result)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x2a,"int main(void)");
  }
  chck_buffer_seek(&local_b0,0,0);
  iVar6 = bcmp(local_b0,"Hello buffer, I\'m in your buffer at 10:00 clock!",0x30);
  if (iVar6 != 0) {
    __assert_fail("!memcmp(buf.buffer, result, strlen(result))",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x2c,"int main(void)");
  }
  chck_buffer_release(&local_b0);
  lVar9 = 0;
  bVar2 = true;
  do {
    bVar11 = bVar2;
    uVar7 = (&DAT_00104db0)[lVar9 * 6];
    cVar3 = chck_buffer_from_pointer
                      (&local_b0,(&PTR_anon_var_dwarf_148_00104da0)[lVar9 * 3],0x2e,uVar7);
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer_from_pointer(&buf, tests[t].data, tests[t].size, tests[t].endianess)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x49,"int main(void)");
    }
    if (uVar7 != local_90) {
      __assert_fail("buf.endianess == tests[t].endianess",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x4a,"int main(void)");
    }
    cVar3 = chck_buffer_read_string(&local_88,local_58,&local_b0);
    pcVar13 = local_88;
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer_read_string(&str, &len, &buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x4c,"int main(void)");
    }
    if (local_58[0] != (char *)0x12) {
      __assert_fail("len == strlen(\"this integer is 5:\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x4d,"int main(void)");
    }
    iVar6 = strcmp(local_88,"this integer is 5:");
    if (iVar6 != 0) {
      __assert_fail("!strcmp(str, \"this integer is 5:\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x4e,"int main(void)");
    }
    free(pcVar13);
    cVar3 = chck_buffer_read_string_of_type(&local_88,0,1,&local_b0);
    pcVar13 = local_88;
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer_read_string_of_type(&str, NULL, sizeof(uint8_t), &buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x4f,"int main(void)");
    }
    iVar6 = strcmp(local_88,"this integer is 5:");
    if (iVar6 != 0) {
      __assert_fail("strcmp(str, \"this integer is 5:\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x50,"int main(void)");
    }
    free(pcVar13);
    cVar3 = chck_buffer_read_int(&local_b4,4,&local_b0);
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer_read_int(&i, sizeof(i), &buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x51,"int main(void)");
    }
    if (local_b4 != 5) {
      __assert_fail("i == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x52,"int main(void)");
    }
    cVar3 = chck_buffer_read_int(&local_b8,2,&local_b0);
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer_read_int(&s, sizeof(s), &buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x53,"int main(void)");
    }
    if (local_b8 != 1) {
      __assert_fail("s == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x54,"int main(void)");
    }
    cVar3 = chck_buffer_read_int(&local_b5,1,&local_b0);
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer_read_int(&c, sizeof(c), &buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x55,"int main(void)");
    }
    if (local_b5 != '\x01') {
      __assert_fail("c == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x56,"int main(void)");
    }
    if ((long *)(local_a0 + (long)local_b0) != local_a8) {
      __assert_fail("(buf.curpos - buf.buffer) - buf.size == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x57,"int main(void)");
    }
    chck_buffer_release(&local_b0);
    lVar9 = 1;
    bVar2 = false;
  } while (bVar11);
  local_88 = (char *)0x20;
  local_b4 = 8;
  local_b8 = 6;
  uVar10 = 0;
  bVar2 = true;
  do {
    bVar11 = bVar2;
    cVar3 = chck_buffer(&local_b0,0xb,(&DAT_00103b20)[uVar10]);
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer(&buf, 5+6, tests[t])",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x65,"int main(void)");
    }
    if (uVar10 == ((ulong)local_90 ^ 1)) {
      __assert_fail("(tests[t] == CHCK_ENDIANESS_NATIVE) == chck_buffer_native_endianess(&buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x66,"int main(void)");
    }
    cVar3 = chck_buffer_write_string("test",4,&local_b0);
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer_write_string(\"test\", 4, &buf) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x68,"int main(void)");
    }
    cVar3 = chck_buffer_write_string_of_type("test",4,1,&local_b0);
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer_write_string_of_type(\"test\", 4, sizeof(uint8_t), &buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x69,"int main(void)");
    }
    cVar3 = chck_buffer_resize(&local_b0,0x19);
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer_resize(&buf, 5+6+sizeof(uint64_t)+sizeof(int32_t)+sizeof(int16_t))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x6a,"int main(void)");
    }
    if (local_a0 != 0x19) {
      __assert_fail("buf.size == 5+6+sizeof(uint64_t)+sizeof(int32_t)+sizeof(int16_t)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x6b,"int main(void)");
    }
    if ((long)local_a8 - (long)local_b0 != 0xb) {
      __assert_fail("buf.curpos - buf.buffer == 6+5",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x6c,"int main(void)");
    }
    if (local_b0 == local_a8) {
      __assert_fail("buf.buffer != buf.curpos",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x6d,"int main(void)");
    }
    cVar3 = chck_buffer_write_int(&local_88,8,&local_b0);
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer_write_int(&l, sizeof(l), &buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x6f,"int main(void)");
    }
    cVar3 = chck_buffer_write_int(&local_b4,4,&local_b0);
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer_write_int(&i, sizeof(i), &buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x70,"int main(void)");
    }
    cVar3 = chck_buffer_write_int(&local_b8,2,&local_b0);
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer_write_int(&s, sizeof(s), &buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x71,"int main(void)");
    }
    if ((long *)(local_a0 + (long)local_b0) != local_a8) {
      __assert_fail("(buf.curpos - buf.buffer) - buf.size == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x72,"int main(void)");
    }
    lVar9 = chck_buffer_seek(&local_b0,0,0);
    if (lVar9 != (long)local_a8 - (long)local_b0) {
      __assert_fail("chck_buffer_seek(&buf, 0, SEEK_SET) == buf.curpos - buf.buffer",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x74,"int main(void)");
    }
    if (local_a8 != local_b0) {
      __assert_fail("buf.curpos - buf.buffer == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x75,"int main(void)");
    }
    cVar3 = chck_buffer_read_string(local_58,0,&local_b0);
    pcVar13 = local_58[0];
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer_read_string(&str, NULL, &buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x77,"int main(void)");
    }
    iVar6 = strcmp(local_58[0],"test");
    if (iVar6 != 0) {
      __assert_fail("strcmp(str, \"test\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x78,"int main(void)");
    }
    free(pcVar13);
    cVar3 = chck_buffer_read_string_of_type(local_58,0,1,&local_b0);
    pcVar13 = local_58[0];
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer_read_string_of_type(&str, NULL, sizeof(uint8_t), &buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x79,"int main(void)");
    }
    iVar6 = strcmp(local_58[0],"test");
    if (iVar6 != 0) {
      __assert_fail("strcmp(str, \"test\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x7a,"int main(void)");
    }
    free(pcVar13);
    cVar3 = chck_buffer_read_int(&local_88,8,&local_b0);
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer_read_int(&l, sizeof(l), &buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x7b,"int main(void)");
    }
    if (local_88 != (char *)0x20) {
      __assert_fail("l == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x7c,"int main(void)");
    }
    cVar3 = chck_buffer_read_int(&local_b4,4,&local_b0);
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer_read_int(&i, sizeof(i), &buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x7d,"int main(void)");
    }
    if (local_b4 != 8) {
      __assert_fail("i == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x7e,"int main(void)");
    }
    cVar3 = chck_buffer_read_int(&local_b8,2,&local_b0);
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer_read_int(&s, sizeof(s), &buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x7f,"int main(void)");
    }
    if (local_b8 != 6) {
      __assert_fail("s == 6",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x80,"int main(void)");
    }
    if ((long *)(local_a0 + (long)local_b0) != local_a8) {
      __assert_fail("(buf.curpos - buf.buffer) - buf.size == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x81,"int main(void)");
    }
    chck_buffer_release(&local_b0);
    uVar10 = 1;
    bVar2 = false;
  } while (bVar11);
  local_88 = (char *)0x2e2e2e2e2e2e2e2e;
  cStack_80 = '.';
  cStack_7f = '.';
  cStack_7e = '.';
  cStack_7d = '.';
  cStack_7c = '.';
  cStack_7b = '.';
  cStack_7a = '.';
  cStack_79 = '.';
  cStack_78 = '.';
  cStack_77 = '.';
  cStack_76 = '.';
  cStack_75 = '.';
  cStack_74 = '.';
  cStack_73 = '\0';
  chck_buffer_from_pointer(&local_b0,&local_88,0x16,2);
  cVar3 = chck_buffer_has_zlib();
  if (cVar3 == '\0') {
    __assert_fail("chck_buffer_has_zlib()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x8d,"int main(void)");
  }
  cVar3 = chck_buffer_compress_zlib(&local_b0);
  if (cVar3 == '\0') {
    __assert_fail("chck_buffer_compress_zlib(&buf)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x8e,"int main(void)");
  }
  if (local_a0 != 0xc) {
    __assert_fail("buf.size == sizeof(compressed)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x8f,"int main(void)");
  }
  if ((int)local_b0[1] != -0x38fca1d3 || *local_b0 != 0x1802c3d3d39c78) {
    __assert_fail("memcmp(buf.buffer, compressed, sizeof(compressed)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x90,"int main(void)");
  }
  cVar3 = chck_buffer_decompress_zlib(&local_b0);
  if (cVar3 == '\0') {
    __assert_fail("chck_buffer_decompress_zlib(&buf)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x92,"int main(void)");
  }
  if (local_a0 != 0x16) {
    __assert_fail("buf.size == sizeof(uncompressed)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x93,"int main(void)");
  }
  auVar1 = *(undefined1 (*) [16])((long)local_b0 + 6);
  auVar14[0] = -((char)*local_b0 == (char)local_88);
  auVar14[1] = -(*(char *)((long)local_b0 + 1) == local_88._1_1_);
  auVar14[2] = -(*(char *)((long)local_b0 + 2) == local_88._2_1_);
  auVar14[3] = -(*(char *)((long)local_b0 + 3) == local_88._3_1_);
  auVar14[4] = -(*(char *)((long)local_b0 + 4) == local_88._4_1_);
  auVar14[5] = -(*(char *)((long)local_b0 + 5) == local_88._5_1_);
  auVar14[6] = -(*(char *)((long)local_b0 + 6) == local_88._6_1_);
  auVar14[7] = -(*(char *)((long)local_b0 + 7) == local_88._7_1_);
  auVar14[8] = -((char)local_b0[1] == cStack_80);
  auVar14[9] = -(*(char *)((long)local_b0 + 9) == cStack_7f);
  auVar14[10] = -(*(char *)((long)local_b0 + 10) == cStack_7e);
  auVar14[0xb] = -(*(char *)((long)local_b0 + 0xb) == cStack_7d);
  auVar14[0xc] = -(*(char *)((long)local_b0 + 0xc) == cStack_7c);
  auVar14[0xd] = -(*(char *)((long)local_b0 + 0xd) == cStack_7b);
  auVar14[0xe] = -(*(char *)((long)local_b0 + 0xe) == cStack_7a);
  auVar14[0xf] = -(*(char *)((long)local_b0 + 0xf) == cStack_79);
  auVar15[0] = -(local_88._6_1_ == auVar1[0]);
  auVar15[1] = -(local_88._7_1_ == auVar1[1]);
  auVar15[2] = -(cStack_80 == auVar1[2]);
  auVar15[3] = -(cStack_7f == auVar1[3]);
  auVar15[4] = -(cStack_7e == auVar1[4]);
  auVar15[5] = -(cStack_7d == auVar1[5]);
  auVar15[6] = -(cStack_7c == auVar1[6]);
  auVar15[7] = -(cStack_7b == auVar1[7]);
  auVar15[8] = -(cStack_7a == auVar1[8]);
  auVar15[9] = -(cStack_79 == auVar1[9]);
  auVar15[10] = -(cStack_78 == auVar1[10]);
  auVar15[0xb] = -(cStack_77 == auVar1[0xb]);
  auVar15[0xc] = -(cStack_76 == auVar1[0xc]);
  auVar15[0xd] = -(cStack_75 == auVar1[0xd]);
  auVar15[0xe] = -(cStack_74 == auVar1[0xe]);
  auVar15[0xf] = -(cStack_73 == auVar1[0xf]);
  auVar14 = auVar14 & auVar15;
  if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("memcmp(buf.buffer, uncompressed, sizeof(uncompressed)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x94,"int main(void)");
  }
  chck_buffer_release(&local_b0);
  uVar12 = CONCAT71((int7)((ulong)local_58 >> 8),1);
  lVar9 = 0;
  do {
    cVar3 = chck_buffer(&local_b0,0x3ffffc0,(&DAT_00103b20)[lVar9]);
    if (cVar3 == '\0') {
      __assert_fail("chck_buffer(&buf, iters * sizeof(uint64_t) * sizeof(uint32_t) * sizeof(uint16_t) * sizeof(uint8_t), tests[i])"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0xa3,"int main(void)");
    }
    local_88 = (char *)0x0;
    do {
      cVar3 = chck_buffer_write_int(&local_88,8,&local_b0);
      if (cVar3 == '\0') {
        __assert_fail("chck_buffer_write_int(&a, sizeof(a), &buf)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                      ,0xa4,"int main(void)");
      }
      local_88 = (char *)((long)local_88 + 1);
    } while (local_88 < 0xfffff);
    local_88 = (char *)((ulong)local_88 & 0xffffffff00000000);
    do {
      cVar3 = chck_buffer_write_int(&local_88,4,&local_b0);
      if (cVar3 == '\0') {
        __assert_fail("chck_buffer_write_int(&a, sizeof(a), &buf)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                      ,0xa5,"int main(void)");
      }
      uVar7 = (int)local_88 + 1;
      local_88 = (char *)CONCAT44(local_88._4_4_,uVar7);
    } while (uVar7 < 0xfffff);
    local_88 = (char *)((ulong)local_88 & 0xffffffffffff0000);
    do {
      cVar3 = chck_buffer_write_int(&local_88,2,&local_b0);
      if (cVar3 == '\0') {
        __assert_fail("chck_buffer_write_int(&a, sizeof(a), &buf)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                      ,0xa6,"int main(void)");
      }
      sVar5 = (short)local_88 + 1;
      local_88 = (char *)CONCAT62(local_88._2_6_,sVar5);
    } while (sVar5 != -1);
    local_88 = (char *)((ulong)local_88 & 0xffffffffffffff00);
    do {
      cVar3 = chck_buffer_write_int(&local_88,1,&local_b0);
      if (cVar3 == '\0') {
        __assert_fail("chck_buffer_write_int(&a, sizeof(a), &buf)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                      ,0xa7,"int main(void)");
      }
      cVar3 = (char)local_88 + '\x01';
      local_88 = (char *)CONCAT71(local_88._1_7_,cVar3);
    } while (cVar3 != -1);
    local_5c = (uint)uVar12;
    iVar6 = 0xfffff;
    do {
      cVar3 = chck_buffer_write_string("yolo",4,&local_b0);
      if (cVar3 == '\0') {
        __assert_fail("chck_buffer_write_string(\"yolo\", 4, &buf)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                      ,0xa8,"int main(void)");
      }
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    chck_buffer_seek(&local_b0,0,0);
    pcVar13 = (char *)0x0;
    do {
      cVar3 = chck_buffer_read_int(&local_88,8,&local_b0);
      if (cVar3 == '\0') {
        pcVar13 = "chck_buffer_read_int(&t, sizeof(t), &buf)";
LAB_00101c14:
        __assert_fail(pcVar13,
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                      ,0xaa,"int main(void)");
      }
      if (pcVar13 != local_88) {
        pcVar13 = "a == t";
        goto LAB_00101c14;
      }
      pcVar13 = pcVar13 + 1;
    } while (pcVar13 != (char *)0xfffff);
    iVar6 = 0;
    do {
      cVar3 = chck_buffer_read_int(&local_88,4,&local_b0);
      if (cVar3 == '\0') {
        pcVar13 = "chck_buffer_read_int(&t, sizeof(t), &buf)";
LAB_00101c3c:
        __assert_fail(pcVar13,
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                      ,0xab,"int main(void)");
      }
      if (iVar6 != (int)local_88) {
        pcVar13 = "a == t";
        goto LAB_00101c3c;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0xfffff);
    sVar5 = 0;
    do {
      cVar3 = chck_buffer_read_int(&local_88,2,&local_b0);
      if (cVar3 == '\0') {
        pcVar13 = "chck_buffer_read_int(&t, sizeof(t), &buf)";
LAB_00101c64:
        __assert_fail(pcVar13,
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                      ,0xac,"int main(void)");
      }
      if (sVar5 != (short)local_88) {
        pcVar13 = "a == t";
        goto LAB_00101c64;
      }
      sVar5 = sVar5 + 1;
    } while (sVar5 != -1);
    cVar3 = '\0';
    do {
      cVar4 = chck_buffer_read_int(&local_88,1,&local_b0);
      if (cVar4 == '\0') {
        pcVar13 = "chck_buffer_read_int(&t, sizeof(t), &buf)";
LAB_00101c8c:
        __assert_fail(pcVar13,
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                      ,0xad,"int main(void)");
      }
      if (cVar3 != (char)local_88) {
        pcVar13 = "a == t";
        goto LAB_00101c8c;
      }
      cVar3 = cVar3 + '\x01';
    } while (cVar3 != -1);
    iVar6 = 0xfffff;
    do {
      cVar3 = chck_buffer_read_string(&local_88,local_58,&local_b0);
      pcVar13 = local_88;
      if (cVar3 == '\0') {
        __assert_fail("chck_buffer_read_string(&t, &len, &buf)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                      ,0xb1,"int main(void)");
      }
      iVar8 = strcmp(local_88,"yolo");
      if (iVar8 != 0) {
        __assert_fail("!strcmp(t, \"yolo\")",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                      ,0xb2,"int main(void)");
      }
      if (local_58[0] != (char *)0x4) {
        __assert_fail("len == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                      ,0xb3,"int main(void)");
      }
      free(pcVar13);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    chck_buffer_release(&local_b0);
    lVar9 = 1;
    uVar12 = 0;
    if ((local_5c & 1) == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int main(void)
{
   /* TEST: ownership move */
   {
      struct chck_buffer buf;
      assert(chck_buffer(&buf, 1, CHCK_ENDIANESS_NATIVE));
      buf.copied = false;
      free(buf.buffer);
      chck_buffer_release(&buf); // should not SIGSEGV
   }

   /* TEST: over-read */
   {
      struct chck_buffer buf;
      char data[] = "yolo I have only this many bytes";
      assert(chck_buffer_from_pointer(&buf, data, sizeof(data), CHCK_ENDIANESS_NATIVE));
      char bb[sizeof(data)];
      assert(chck_buffer_read(bb, 1, sizeof(data), &buf) == sizeof(data));
      chck_buffer_seek(&buf, 0, SEEK_SET);
      assert(chck_buffer_read(bb, 1, sizeof(data) * 4, &buf) == sizeof(data));
      chck_buffer_seek(&buf, 0, SEEK_SET);
      assert(chck_buffer_read(bb, 8, sizeof(data), &buf) == 4);
      assert(chck_buffer_read(bb, 12, sizeof(data), &buf) == 0);
      assert(chck_buffer_read(bb, 1, sizeof(data), &buf) == 1);
      chck_buffer_release(&buf);
   }

   /* TEST: writing format */
   {
      struct chck_buffer buf;
      assert(chck_buffer(&buf, 1, CHCK_ENDIANESS_NATIVE));
      const char *result = "Hello buffer, I'm in your buffer at 10:00 clock!";
      assert(chck_buffer_write_format(&buf, "Hello %s, I'm in your buffer at %d:%.2d clock!", "buffer", 10, 0) == strlen(result));
      chck_buffer_seek(&buf, 0, SEEK_SET);
      assert(!memcmp(buf.buffer, result, strlen(result)));
      chck_buffer_release(&buf);

   }

   /* TEST: little endian buffer */
   {
      const struct {
         char *data;
         size_t size;
         enum chck_endianess endianess;
      } tests[] = {
         {
            .data = "\x1\x12this integer is 5:\x12this integer is 5:\x5\x0\x0\0\1\0\1",
            .size = sizeof("\x0\x12this integer is 5:\x12this integer is 5:\x5\x0\x0\0\1\0\1") - 1,
            .endianess = CHCK_ENDIANESS_LITTLE,
         }, {
            .data = "\x1\x12this integer is 5:\x12this integer is 5:\x0\x0\0\x5\0\1\1",
            .size = sizeof("\x0\x12this integer is 5:\x12this integer is 5:\x0\x0\0\x5\0\1\1") - 1,
            .endianess = CHCK_ENDIANESS_BIG,
         },
      };

      for (int t = 0; t < 2; ++t) {
         int32_t i;
         int16_t s;
         int8_t c;
         char *str;
         struct chck_buffer buf;
         assert(chck_buffer_from_pointer(&buf, tests[t].data, tests[t].size, tests[t].endianess));
         assert(buf.endianess == tests[t].endianess);
         size_t len;
         assert(chck_buffer_read_string(&str, &len, &buf));
         assert(len == strlen("this integer is 5:"));
         assert(!strcmp(str, "this integer is 5:")); free(str);
         assert(chck_buffer_read_string_of_type(&str, NULL, sizeof(uint8_t), &buf));
         assert(strcmp(str, "this integer is 5:") == 0); free(str);
         assert(chck_buffer_read_int(&i, sizeof(i), &buf));
         assert(i == 5);
         assert(chck_buffer_read_int(&s, sizeof(s), &buf));
         assert(s == 1);
         assert(chck_buffer_read_int(&c, sizeof(c), &buf));
         assert(c == 1);
         assert((buf.curpos - buf.buffer) - buf.size == 0);
         chck_buffer_release(&buf);
      }
   }

   /* TEST: buffer write && read && resize */
   {
      int64_t l = 32;
      int32_t i = 8;
      int16_t s = 6;
      enum chck_endianess tests[] = { CHCK_ENDIANESS_NATIVE, !chck_endianess() };
      for (int t = 0; t < 2; ++t) {
         char *str;
         struct chck_buffer buf;
         assert(chck_buffer(&buf, 5+6, tests[t]));
         assert((tests[t] == CHCK_ENDIANESS_NATIVE) == chck_buffer_native_endianess(&buf));

         assert(chck_buffer_write_string("test", 4, &buf) == 1);
         assert(chck_buffer_write_string_of_type("test", 4, sizeof(uint8_t), &buf));
         assert(chck_buffer_resize(&buf, 5+6+sizeof(uint64_t)+sizeof(int32_t)+sizeof(int16_t)));
         assert(buf.size == 5+6+sizeof(uint64_t)+sizeof(int32_t)+sizeof(int16_t));
         assert(buf.curpos - buf.buffer == 6+5);
         assert(buf.buffer != buf.curpos);

         assert(chck_buffer_write_int(&l, sizeof(l), &buf));
         assert(chck_buffer_write_int(&i, sizeof(i), &buf));
         assert(chck_buffer_write_int(&s, sizeof(s), &buf));
         assert((buf.curpos - buf.buffer) - buf.size == 0);

         assert(chck_buffer_seek(&buf, 0, SEEK_SET) == buf.curpos - buf.buffer);
         assert(buf.curpos - buf.buffer == 0);

         assert(chck_buffer_read_string(&str, NULL, &buf));
         assert(strcmp(str, "test") == 0); free(str);
         assert(chck_buffer_read_string_of_type(&str, NULL, sizeof(uint8_t), &buf));
         assert(strcmp(str, "test") == 0); free(str);
         assert(chck_buffer_read_int(&l, sizeof(l), &buf));
         assert(l == 32);
         assert(chck_buffer_read_int(&i, sizeof(i), &buf));
         assert(i == 8);
         assert(chck_buffer_read_int(&s, sizeof(s), &buf));
         assert(s == 6);
         assert((buf.curpos - buf.buffer) - buf.size == 0);
         chck_buffer_release(&buf);
      }
   }

   /* TEST: zlib compression && decompression */
   {
      char uncompressed[] = ".....................";
      struct chck_buffer buf;
      chck_buffer_from_pointer(&buf, uncompressed, sizeof(uncompressed), CHCK_ENDIANESS_NATIVE);
#if HAS_ZLIB
      uint8_t compressed[] = { 0x78, 0x9c, 0xd3, 0xd3, 0xc3, 0x2, 0x18, 0x0, 0x2d, 0x5e, 0x3, 0xc7 };
      assert(chck_buffer_has_zlib());
      assert(chck_buffer_compress_zlib(&buf));
      assert(buf.size == sizeof(compressed));
      assert(memcmp(buf.buffer, compressed, sizeof(compressed)) == 0);

      assert(chck_buffer_decompress_zlib(&buf));
      assert(buf.size == sizeof(uncompressed));
      assert(memcmp(buf.buffer, uncompressed, sizeof(uncompressed)) == 0);
#else
      assert(!chck_buffer_has_zlib());
      assert(!chck_buffer_compress_zlib(&buf));
      assert(!chck_buffer_decompress_zlib(&buf));
#endif
      chck_buffer_release(&buf);
   }

   /* TEST: benchmark read/write (small writes, native && non-native) */
   {
      const uint32_t iters = 0xFFFFF;
      enum chck_endianess tests[] = { CHCK_ENDIANESS_NATIVE, !chck_endianess() };
      for (int i = 0; i < 2; ++i) {
         struct chck_buffer buf;
         assert(chck_buffer(&buf, iters * sizeof(uint64_t) * sizeof(uint32_t) * sizeof(uint16_t) * sizeof(uint8_t), tests[i]));
         for (uint64_t a = 0; a < iters; ++a) assert(chck_buffer_write_int(&a, sizeof(a), &buf));
         for (uint32_t a = 0; a < iters; ++a) assert(chck_buffer_write_int(&a, sizeof(a), &buf));
         for (uint16_t a = 0; a < 0xFFFF; ++a) assert(chck_buffer_write_int(&a, sizeof(a), &buf));
         for (uint8_t a = 0; a < 0xFF; ++a) assert(chck_buffer_write_int(&a, sizeof(a), &buf));
         for (uint32_t a = 0; a < iters; ++a) assert(chck_buffer_write_string("yolo", 4, &buf));
         chck_buffer_seek(&buf, 0, SEEK_SET);
         for (uint64_t t, a = 0; a < iters; ++a) { assert(chck_buffer_read_int(&t, sizeof(t), &buf)); assert(a == t); }
         for (uint32_t t, a = 0; a < iters; ++a) { assert(chck_buffer_read_int(&t, sizeof(t), &buf)); assert(a == t); }
         for (uint16_t t, a = 0; a < 0xFFFF; ++a) { assert(chck_buffer_read_int(&t, sizeof(t), &buf)); assert(a == t); }
         for (uint8_t t, a = 0; a < 0xFF; ++a) { assert(chck_buffer_read_int(&t, sizeof(t), &buf)); assert(a == t); }
         for (uint32_t a = 0; a < iters; ++a) {
            char *t;
            size_t len;
            assert(chck_buffer_read_string(&t, &len, &buf));
            assert(!strcmp(t, "yolo"));
            assert(len == 4);
            free(t);
         }
         chck_buffer_release(&buf);
      }
   }

   return EXIT_SUCCESS;
}